

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O1

bool __thiscall
sentencepiece::unigram::Model::VerifyOutputsEquivalent
          (Model *this,string_view expected,string_view actual)

{
  float fVar1;
  size_t sVar2;
  void *pvVar3;
  float fVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  pointer pbVar8;
  string_view str;
  string_view delim;
  string_view delim_00;
  float local_ac;
  float local_a8;
  char local_a2 [2];
  Splitter local_a0;
  char *local_88;
  size_t local_80;
  undefined1 local_78 [16];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_60;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_48;
  
  local_88 = actual._M_str;
  local_80 = actual._M_len;
  local_a2[0] = ' ';
  local_a2[1] = '\0';
  sVar6 = strlen(local_a2);
  delim._M_str = local_a2;
  delim._M_len = sVar6;
  absl::internal::Splitter::Splitter(&local_a0,expected,delim,false);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_48,&local_a0.result_);
  if (local_48.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_a8 = 0.0;
  }
  else {
    fVar1 = this->min_score_;
    local_a8 = 0.0;
    pbVar8 = local_48.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      sVar2 = pbVar8->_M_len;
      iVar5 = (*(this->super_ModelInterface)._vptr_ModelInterface[0xe])(this,sVar2,pbVar8->_M_str);
      fVar4 = fVar1 + -10.0;
      if (iVar5 != (this->super_ModelInterface).unk_id_) {
        pvVar3 = ((((this->super_ModelInterface).model_proto_)->pieces_).super_RepeatedPtrFieldBase.
                 rep_)->elements[iVar5];
        if (*(int *)((long)pvVar3 + 0x3c) == 4) {
          fVar4 = (float)(int)sVar2 * this->max_score_ + -0.1;
        }
        else {
          fVar4 = *(float *)((long)pvVar3 + 0x38);
        }
      }
      local_a8 = local_a8 + fVar4;
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != local_48.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_48.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_a0.result_.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_a0.result_.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_1_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_a0.result_.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  local_a2[0] = ' ';
  local_a2[1] = '\0';
  sVar6 = strlen(local_a2);
  str._M_str = local_88;
  str._M_len = local_80;
  delim_00._M_str = local_a2;
  delim_00._M_len = sVar6;
  absl::internal::Splitter::Splitter(&local_a0,str,delim_00,false);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&local_60,&local_a0.result_);
  if (local_60.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_60.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_ac = 0.0;
  }
  else {
    local_78._0_4_ = this->min_score_ + -10.0;
    local_ac = 0.0;
    pbVar8 = local_60.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      sVar2 = pbVar8->_M_len;
      iVar5 = (*(this->super_ModelInterface)._vptr_ModelInterface[0xe])(this,sVar2,pbVar8->_M_str);
      if (iVar5 == (this->super_ModelInterface).unk_id_) {
        fVar1 = (float)local_78._0_4_;
      }
      else {
        pvVar3 = ((((this->super_ModelInterface).model_proto_)->pieces_).super_RepeatedPtrFieldBase.
                 rep_)->elements[iVar5];
        if (*(int *)((long)pvVar3 + 0x3c) == 4) {
          fVar1 = (float)(int)sVar2 * this->max_score_ + -0.1;
        }
        else {
          fVar1 = *(float *)((long)pvVar3 + 0x38);
        }
      }
      local_ac = local_ac + fVar1;
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != local_60.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_60.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_a0.result_.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,
                            local_a0.result_.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_1_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_a0.result_.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  local_78._0_4_ = ABS(local_a8 - local_ac);
  if (1e-07 < (float)local_78._0_4_) {
    local_78 = ZEXT416((uint)local_78._0_4_);
    iVar5 = logging::GetMinLogLevel();
    if (iVar5 < 2) {
      local_a0.result_.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"unigram_model.cc",0x10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,0x371);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"LOG(",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"WARNING",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"Two sentence piece sequences are not equivalent! Left: ",0x37);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,expected._M_str,expected._M_len);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", Score: ",9);
      poVar7 = std::ostream::_M_insert<double>((double)local_a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,". Right: ",9);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_88,local_80);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", Score: ",9);
      poVar7 = std::ostream::_M_insert<double>((double)local_ac);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
      error::Die::~Die((Die *)&local_a0);
    }
  }
  return (float)local_78._0_4_ <= 1e-07;
}

Assistant:

bool Model::VerifyOutputsEquivalent(absl::string_view expected,
                                    absl::string_view actual) const {
  auto compute_unigram_model_score =
      [this](std::vector<absl::string_view> output_pieces) {
        float total_score = 0;
        const float unk_score = min_score() - kUnkPenalty;
        for (const auto p : output_pieces) {
          const auto id = PieceToId(p);
          if (id == unk_id_) {
            total_score += unk_score;
          } else {
            const int length = p.size();
            total_score += IsUserDefinedInlined(id)
                               ? (length * max_score_ - 0.1)
                               : GetScoreInlined(id);
          }
        }
        return total_score;
      };
  const auto expected_score =
      compute_unigram_model_score(absl::StrSplit(expected, ' '));
  const auto actual_score =
      compute_unigram_model_score(absl::StrSplit(actual, ' '));
  if (std::abs(expected_score - actual_score) > kEpsilon) {
    LOG(WARNING) << "Two sentence piece sequences are not equivalent! Left: "
                 << expected << ", Score: " << expected_score
                 << ". Right: " << actual << ", Score: " << actual_score << ".";
    return false;
  }
  return true;
}